

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey.c
# Opt level: O1

int main(void)

{
  int line;
  int iVar1;
  int line_00;
  int line_01;
  int iVar2;
  int in_ECX;
  char *pcVar3;
  int in_EDX;
  int family;
  int sock;
  int family_00;
  int sock_00;
  int family_01;
  int sock_01;
  int sock_02;
  int sock_03;
  int sock_04;
  int sock_05;
  char buf [7];
  int deadline;
  undefined1 local_3b [7];
  char local_34 [4];
  
  line = test_socket_impl((char *)0x2a,0x62,in_EDX,in_ECX);
  pcVar3 = local_34;
  local_34[0] = -0xc;
  local_34[1] = '\x01';
  local_34[2] = '\0';
  local_34[3] = '\0';
  iVar1 = nn_setsockopt(line,0x62,1,pcVar3,4);
  if (iVar1 == 0) {
    iVar1 = nn_bind(line,"inproc://test");
    if (iVar1 < 0) goto LAB_00101912;
    iVar1 = test_socket_impl((char *)0x30,99,family,(int)pcVar3);
    test_connect_impl((char *)0x31,iVar1,sock,pcVar3);
    line_00 = test_socket_impl((char *)0x32,99,family_00,(int)pcVar3);
    test_connect_impl((char *)0x33,line_00,sock_00,pcVar3);
    line_01 = test_socket_impl((char *)0x34,99,family_01,(int)pcVar3);
    test_connect_impl((char *)0x35,line_01,sock_01,pcVar3);
    pcVar3 = (char *)0x0;
    iVar2 = nn_recv(line,local_3b,7);
    if (iVar2 == -1) {
      iVar2 = nn_errno();
      if (iVar2 != 0x9523dfe) goto LAB_001018f9;
      test_send_impl((char *)0x3c,line,0x102117,pcVar3);
      test_recv_impl((char *)0x3f,iVar1,0x102117,pcVar3);
      test_send_impl((char *)0x40,iVar1,0x10211b,pcVar3);
      test_recv_impl((char *)0x43,line_00,0x102117,pcVar3);
      test_send_impl((char *)0x44,line_00,0x10211b,pcVar3);
      test_recv_impl((char *)0x47,line,0x10211b,pcVar3);
      test_recv_impl((char *)0x48,line,0x10211b,pcVar3);
      pcVar3 = (char *)0x0;
      iVar2 = nn_recv(line,local_3b,7);
      if (iVar2 != -1) goto LAB_001018fe;
      iVar2 = nn_errno();
      if (iVar2 != 0x6e) goto LAB_001018fe;
      test_recv_impl((char *)0x4f,line_01,0x102117,pcVar3);
      test_send_impl((char *)0x50,line_01,0x10211f,pcVar3);
      test_send_impl((char *)0x53,line,0x102117,pcVar3);
      iVar2 = nn_recv(line,local_3b,7,0);
      if (iVar2 != -1) goto LAB_00101903;
      iVar2 = nn_errno();
      if (iVar2 != 0x6e) goto LAB_00101903;
      iVar2 = nn_recv(line,local_3b,7,0);
      if (iVar2 == -1) {
        iVar2 = nn_errno();
        if (iVar2 == 0x9523dfe) {
          test_close_impl((char *)0x5d,line,sock_02);
          test_close_impl((char *)0x5e,iVar1,sock_03);
          test_close_impl((char *)0x5f,line_00,sock_04);
          test_close_impl((char *)0x60,line_01,sock_05);
          return 0;
        }
      }
    }
    else {
LAB_001018f9:
      main_cold_2();
LAB_001018fe:
      main_cold_3();
LAB_00101903:
      main_cold_4();
    }
    main_cold_5();
  }
  main_cold_1();
LAB_00101912:
  main_cold_6();
}

Assistant:

int main ()
{
    int rc;
    int surveyor;
    int respondent1;
    int respondent2;
    int respondent3;
    int deadline;
    char buf [7];

    /*  Test a simple survey with three respondents. */
    surveyor = test_socket (AF_SP, NN_SURVEYOR);
    deadline = 500;
    rc = nn_setsockopt (surveyor, NN_SURVEYOR, NN_SURVEYOR_DEADLINE,
        &deadline, sizeof (deadline));
    errno_assert (rc == 0);
    test_bind (surveyor, SOCKET_ADDRESS);
    respondent1 = test_socket (AF_SP, NN_RESPONDENT);
    test_connect (respondent1, SOCKET_ADDRESS);
    respondent2 = test_socket (AF_SP, NN_RESPONDENT);
    test_connect (respondent2, SOCKET_ADDRESS);
    respondent3 = test_socket (AF_SP, NN_RESPONDENT);
    test_connect (respondent3, SOCKET_ADDRESS);

    /* Check that attempt to recv with no survey pending is EFSM. */
    rc = nn_recv (surveyor, buf, sizeof (buf), 0);
    errno_assert (rc == -1 && nn_errno () == EFSM);

    /*  Send the survey. */
    test_send (surveyor, "ABC");

    /*  First respondent answers. */
    test_recv (respondent1, "ABC");
    test_send (respondent1, "DEF");

    /*  Second respondent answers. */
    test_recv (respondent2, "ABC");
    test_send (respondent2, "DEF");

    /*  Surveyor gets the responses. */
    test_recv (surveyor, "DEF");
    test_recv (surveyor, "DEF");

    /*  There are no more responses. Surveyor hits the deadline. */
    rc = nn_recv (surveyor, buf, sizeof (buf), 0);
    errno_assert (rc == -1 && nn_errno () == ETIMEDOUT);

    /*  Third respondent answers (it have already missed the deadline). */
    test_recv (respondent3, "ABC");
    test_send (respondent3, "GHI");

    /*  Surveyor initiates new survey. */
    test_send (surveyor, "ABC");

    /*  Check that stale response from third respondent is not delivered. */
    rc = nn_recv (surveyor, buf, sizeof (buf), 0);
    errno_assert (rc == -1 && nn_errno () == ETIMEDOUT);

    /* Check that subsequent attempt to recv with no survey pending is EFSM. */
    rc = nn_recv (surveyor, buf, sizeof (buf), 0);
    errno_assert (rc == -1 && nn_errno () == EFSM);

    test_close (surveyor);
    test_close (respondent1);
    test_close (respondent2);
    test_close (respondent3);

    return 0;
}